

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O2

int Cnf_SopCountLiterals(char *pSop,int nCubes)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  bool bVar6;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)nCubes;
  if (nCubes < 1) {
    uVar3 = uVar4;
  }
  iVar2 = 0;
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    iVar5 = 4;
    iVar1 = (int)pSop[uVar4];
    while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
      iVar2 = iVar2 + (uint)(iVar1 % 3 != 2);
      iVar1 = iVar1 / 3;
    }
  }
  return iVar2;
}

Assistant:

int Cnf_SopCountLiterals( char * pSop, int nCubes )
{
    int nLits = 0, Cube, i, b;
    for ( i = 0; i < nCubes; i++ )
    {
        Cube = pSop[i];
        for ( b = 0; b < 4; b++ )
        {
            if ( Cube % 3 != 2 )
                nLits++;
            Cube = Cube / 3;
        }
    }
    return nLits;
}